

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calculator.cpp
# Opt level: O2

double Calculator::eval(String *e,Dic<double> *vars)

{
  KeyVal *pKVar1;
  double *pdVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  double dVar6;
  Calculator calc;
  
  Calculator(&calc,e);
  uVar3 = 1;
  for (lVar4 = 0;
      (uVar3 != 0 &&
      (pKVar1 = (vars->super_Map<asl::String,_double>).a._a,
      lVar4 < *(int *)((long)&pKVar1[-1].key.field_2 + 8))); lVar4 = lVar4 + 1) {
    dVar6 = pKVar1[lVar4].value;
    while (0 < (int)uVar3) {
      pKVar1 = (vars->super_Map<asl::String,_double>).a._a;
      while (bVar5 = uVar3 != 0, uVar3 = uVar3 - 1, bVar5) {
        pdVar2 = asl::Map<asl::String,_double>::operator[]
                           (&calc._variables.super_Map<asl::String,_double>,&pKVar1[lVar4].key);
        *pdVar2 = dVar6;
      }
      uVar3 = 0xfffffffe;
    }
    uVar3 = ~uVar3;
  }
  dVar6 = compute(&calc);
  ~Calculator(&calc);
  return dVar6;
}

Assistant:

double Calculator::eval(const String& e, const Dic<double>& vars)
{
	Calculator calc(e);
	foreach2(String& name, double value, vars)
		calc.set(name, value);
	return calc.compute();
}